

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_lower.c
# Opt level: O0

int raviX_ast_lower(CompilerState *compiler_state)

{
  int iVar1;
  int rc;
  CompilerState *compiler_state_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)compiler_state->env);
  if (iVar1 == 0) {
    process_expression(compiler_state,compiler_state->main_function);
  }
  return iVar1;
}

Assistant:

int raviX_ast_lower(CompilerState *compiler_state)
{
	int rc = setjmp(compiler_state->env);
	if (rc == 0) {
		process_expression(compiler_state, compiler_state->main_function);
	} else {
		// dump it?
	}
	return rc;
}